

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trend_suite.cpp
# Opt level: O0

void double_suite::test_alternating(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  close_to<double> predicate_13;
  close_to<double> predicate_14;
  close_to<double> predicate_15;
  close_to<double> predicate_16;
  close_to<double> predicate_17;
  close_to<double> predicate_18;
  close_to<double> predicate_19;
  close_to<double> predicate_20;
  close_to<double> predicate_21;
  close_to<double> predicate_22;
  close_to<double> predicate_23;
  close_to<double> predicate_24;
  close_to<double> predicate_25;
  close_to<double> predicate_26;
  close_to<double> predicate_27;
  close_to<double> predicate_28;
  close_to<double> predicate_29;
  close_to<double> predicate_30;
  close_to<double> predicate_31;
  close_to<double> predicate_32;
  close_to<double> predicate_33;
  close_to<double> predicate_34;
  close_to<double> predicate_35;
  close_to<double> predicate_36;
  double absolute_tolerance;
  double *in_stack_fffffffffffffb08;
  double local_4e8;
  value_type local_4e0;
  size_type local_4d8;
  double local_4c8;
  value_type local_4c0;
  size_type local_4b8;
  double local_4a8;
  value_type local_4a0;
  size_type local_498;
  double local_488;
  value_type local_480;
  size_type local_478;
  double local_468;
  value_type local_460;
  size_type local_458;
  double local_448;
  value_type local_440;
  size_type local_438;
  double local_428;
  value_type local_420;
  size_type local_418;
  double local_408;
  value_type local_400;
  size_type local_3f8;
  double local_3e8;
  value_type local_3e0;
  size_type local_3d8;
  double local_3c8;
  value_type local_3c0;
  size_type local_3b8;
  double local_3a8;
  value_type local_3a0;
  size_type local_398;
  double local_388;
  value_type local_380;
  size_type local_378;
  double local_368;
  value_type local_360;
  size_type local_358;
  double local_348;
  value_type local_340;
  size_type local_338;
  double local_328;
  value_type local_320;
  size_type local_318;
  double local_308;
  value_type local_300;
  size_type local_2f8;
  double local_2e8;
  value_type local_2e0;
  size_type local_2d8;
  double local_2c8;
  value_type local_2c0;
  size_type local_2b8;
  double local_2a8;
  value_type local_2a0;
  size_type local_298;
  double local_288;
  value_type local_280;
  size_type local_278;
  double local_268;
  value_type local_260;
  size_type local_258;
  double local_248;
  value_type local_240;
  size_type local_238;
  double local_228;
  value_type local_220;
  size_type local_218;
  double local_208;
  value_type local_200;
  size_type local_1f8;
  double local_1e8;
  value_type local_1e0;
  size_type local_1d8;
  double local_1c8;
  value_type local_1c0;
  size_type local_1b8;
  double local_1a8;
  value_type local_1a0;
  size_type local_198;
  double local_188;
  value_type local_180;
  size_type local_178;
  double local_168;
  value_type local_160;
  size_type local_158;
  double local_148;
  value_type local_140;
  size_type local_138;
  double local_128;
  value_type local_120;
  size_type local_118;
  double local_108;
  value_type local_100;
  size_type local_f8;
  double local_e8;
  value_type local_e0;
  size_type local_d8;
  double local_c8;
  value_type local_c0;
  size_type local_b8;
  double local_a8;
  value_type local_a0;
  size_type local_98;
  double local_88;
  value_type local_80;
  size_type local_78;
  double local_68;
  value_type local_60;
  size_type local_58;
  double local_48;
  value_type local_40;
  undefined1 local_38 [8];
  trend<double> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.grand.member.count,1e-05,absolute_tolerance);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::basic_trend
            ((basic_trend<double,_(trial::online::with)1> *)local_38);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_40 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_48 = 1.0;
  local_58 = filter.grand.member.count;
  predicate_36.absolute = tolerance.relative;
  predicate_36.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x7e,0x10639d,(char *)&local_40,&local_48,in_stack_fffffffffffffb08,
             predicate_36);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,2.0);
  local_60 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_68 = 2.0;
  local_78 = filter.grand.member.count;
  predicate_35.absolute = tolerance.relative;
  predicate_35.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","2.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x80,0x10639d,(char *)&local_60,&local_68,in_stack_fffffffffffffb08,
             predicate_35);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_80 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_88 = 1.44444;
  local_98 = filter.grand.member.count;
  predicate_34.absolute = tolerance.relative;
  predicate_34.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.44444","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x82,0x10639d,(char *)&local_80,&local_88,in_stack_fffffffffffffb08,
             predicate_34);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,2.0);
  local_a0 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_a8 = 1.83333;
  local_b8 = filter.grand.member.count;
  predicate_33.absolute = tolerance.relative;
  predicate_33.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.83333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x84,0x10639d,(char *)&local_a0,&local_a8,in_stack_fffffffffffffb08,
             predicate_33);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_c0 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_c8 = 1.50667;
  local_d8 = filter.grand.member.count;
  predicate_32.absolute = tolerance.relative;
  predicate_32.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.50667","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x86,0x10639d,(char *)&local_c0,&local_c8,in_stack_fffffffffffffb08,
             predicate_32);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,2.0);
  local_e0 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_e8 = 1.75556;
  local_f8 = filter.grand.member.count;
  predicate_31.absolute = tolerance.relative;
  predicate_31.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.75556","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x88,0x10639d,(char *)&local_e0,&local_e8,in_stack_fffffffffffffb08,
             predicate_31);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_100 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_108 = 1.52517;
  local_118 = filter.grand.member.count;
  predicate_30.absolute = tolerance.relative;
  predicate_30.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.52517","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x8a,0x10639d,(char *)&local_100,&local_108,in_stack_fffffffffffffb08,
             predicate_30);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,2.0);
  local_120 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_128 = 1.70952;
  local_138 = filter.grand.member.count;
  predicate_29.absolute = tolerance.relative;
  predicate_29.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.70952","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x8c,0x10639d,(char *)&local_120,&local_128,in_stack_fffffffffffffb08,
             predicate_29);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_140 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_148 = 1.53192;
  local_158 = filter.grand.member.count;
  predicate_28.absolute = tolerance.relative;
  predicate_28.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.53192","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x8e,0x10639d,(char *)&local_140,&local_148,in_stack_fffffffffffffb08,
             predicate_28);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,2.0);
  local_160 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_168 = 1.67873;
  local_178 = filter.grand.member.count;
  predicate_27.absolute = tolerance.relative;
  predicate_27.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.67873","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x90,0x10639d,(char *)&local_160,&local_168,in_stack_fffffffffffffb08,
             predicate_27);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_180 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_188 = 1.53438;
  local_198 = filter.grand.member.count;
  predicate_26.absolute = tolerance.relative;
  predicate_26.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.53438","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x92,0x10639d,(char *)&local_180,&local_188,in_stack_fffffffffffffb08,
             predicate_26);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,2.0);
  local_1a0 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_1a8 = 1.65652;
  local_1b8 = filter.grand.member.count;
  predicate_25.absolute = tolerance.relative;
  predicate_25.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.65652","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x94,0x10639d,(char *)&local_1a0,&local_1a8,in_stack_fffffffffffffb08,
             predicate_25);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_1c0 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_1c8 = 1.53501;
  local_1d8 = filter.grand.member.count;
  predicate_24.absolute = tolerance.relative;
  predicate_24.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.53501","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x96,0x10639d,(char *)&local_1c0,&local_1c8,in_stack_fffffffffffffb08,
             predicate_24);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,2.0);
  local_1e0 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_1e8 = 1.63965;
  local_1f8 = filter.grand.member.count;
  predicate_23.absolute = tolerance.relative;
  predicate_23.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.63965","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x98,0x10639d,(char *)&local_1e0,&local_1e8,in_stack_fffffffffffffb08,
             predicate_23);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_200 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_208 = 1.53479;
  local_218 = filter.grand.member.count;
  predicate_22.absolute = tolerance.relative;
  predicate_22.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.53479","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x9a,0x10639d,(char *)&local_200,&local_208,in_stack_fffffffffffffb08,
             predicate_22);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,2.0);
  local_220 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_228 = 1.62636;
  local_238 = filter.grand.member.count;
  predicate_21.absolute = tolerance.relative;
  predicate_21.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.62636","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x9c,0x10639d,(char *)&local_220,&local_228,in_stack_fffffffffffffb08,
             predicate_21);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_240 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_248 = 1.53415;
  local_258 = filter.grand.member.count;
  predicate_20.absolute = tolerance.relative;
  predicate_20.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.53415","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x9e,0x10639d,(char *)&local_240,&local_248,in_stack_fffffffffffffb08,
             predicate_20);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,2.0);
  local_260 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_268 = 1.61559;
  local_278 = filter.grand.member.count;
  predicate_19.absolute = tolerance.relative;
  predicate_19.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.61559","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xa0,0x10639d,(char *)&local_260,&local_268,in_stack_fffffffffffffb08,
             predicate_19);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_280 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_288 = 1.53333;
  local_298 = filter.grand.member.count;
  predicate_18.absolute = tolerance.relative;
  predicate_18.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xa2,0x10639d,(char *)&local_280,&local_288,in_stack_fffffffffffffb08,
             predicate_18);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,2.0);
  local_2a0 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_2a8 = 1.60666;
  local_2b8 = filter.grand.member.count;
  predicate_17.absolute = tolerance.relative;
  predicate_17.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.60666","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xa4,0x10639d,(char *)&local_2a0,&local_2a8,in_stack_fffffffffffffb08,
             predicate_17);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1000.0);
  local_2c0 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_2c8 = 139.716;
  local_2d8 = filter.grand.member.count;
  predicate_16.absolute = tolerance.relative;
  predicate_16.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","139.716","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xa9,0x10639d,(char *)&local_2c0,&local_2c8,in_stack_fffffffffffffb08,
             predicate_16);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,2.0);
  local_2e0 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_2e8 = 129.374;
  local_2f8 = filter.grand.member.count;
  predicate_15.absolute = tolerance.relative;
  predicate_15.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","129.374","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xae,0x10639d,(char *)&local_2e0,&local_2e8,in_stack_fffffffffffffb08,
             predicate_15);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_300 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_308 = 119.974;
  local_318 = filter.grand.member.count;
  predicate_14.absolute = tolerance.relative;
  predicate_14.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","119.974","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xb0,0x10639d,(char *)&local_300,&local_308,in_stack_fffffffffffffb08,
             predicate_14);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,2.0);
  local_320 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_328 = 111.631;
  local_338 = filter.grand.member.count;
  predicate_13.absolute = tolerance.relative;
  predicate_13.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","111.631","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xb2,0x10639d,(char *)&local_320,&local_328,in_stack_fffffffffffffb08,
             predicate_13);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_340 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_348 = 103.971;
  local_358 = filter.grand.member.count;
  predicate_12.absolute = tolerance.relative;
  predicate_12.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","103.971","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xb4,0x10639d,(char *)&local_340,&local_348,in_stack_fffffffffffffb08,
             predicate_12);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,2.0);
  local_360 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_368 = 97.1314;
  local_378 = filter.grand.member.count;
  predicate_11.absolute = tolerance.relative;
  predicate_11.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","97.1314","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xb6,0x10639d,(char *)&local_360,&local_368,in_stack_fffffffffffffb08,
             predicate_11);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_380 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_388 = 90.7946;
  local_398 = filter.grand.member.count;
  predicate_10.absolute = tolerance.relative;
  predicate_10.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","90.7946","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xb8,0x10639d,(char *)&local_380,&local_388,in_stack_fffffffffffffb08,
             predicate_10);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,2.0);
  local_3a0 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_3a8 = 85.1106;
  local_3b8 = filter.grand.member.count;
  predicate_09.absolute = tolerance.relative;
  predicate_09.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","85.1106","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xba,0x10639d,(char *)&local_3a0,&local_3a8,in_stack_fffffffffffffb08,
             predicate_09);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_3c0 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_3c8 = 79.8012;
  local_3d8 = filter.grand.member.count;
  predicate_08.absolute = tolerance.relative;
  predicate_08.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","79.8012","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xbc,0x10639d,(char *)&local_3c0,&local_3c8,in_stack_fffffffffffffb08,
             predicate_08);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,2.0);
  local_3e0 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_3e8 = 75.0212;
  local_3f8 = filter.grand.member.count;
  predicate_07.absolute = tolerance.relative;
  predicate_07.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","75.0212","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xbe,0x10639d,(char *)&local_3e0,&local_3e8,in_stack_fffffffffffffb08,
             predicate_07);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_400 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_408 = 70.5231;
  local_418 = filter.grand.member.count;
  predicate_06.absolute = tolerance.relative;
  predicate_06.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","70.5231","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xc0,0x10639d,(char *)&local_400,&local_408,in_stack_fffffffffffffb08,
             predicate_06);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,2.0);
  local_420 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_428 = 66.4618;
  local_438 = filter.grand.member.count;
  predicate_05.absolute = tolerance.relative;
  predicate_05.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","66.4618","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xc2,0x10639d,(char *)&local_420,&local_428,in_stack_fffffffffffffb08,
             predicate_05);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_440 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_448 = 62.614;
  local_458 = filter.grand.member.count;
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","62.614","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xc4,0x10639d,(char *)&local_440,&local_448,in_stack_fffffffffffffb08,
             predicate_04);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,2.0);
  local_460 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_468 = 59.1323;
  local_478 = filter.grand.member.count;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","59.1323","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xc6,0x10639d,(char *)&local_460,&local_468,in_stack_fffffffffffffb08,
             predicate_03);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_480 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_488 = 55.8126;
  local_498 = filter.grand.member.count;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","55.8126","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xc8,0x10639d,(char *)&local_480,&local_488,in_stack_fffffffffffffb08,
             predicate_02);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,2.0);
  local_4a0 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_4a8 = 52.8039;
  local_4b8 = filter.grand.member.count;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","52.8039","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xca,0x10639d,(char *)&local_4a0,&local_4a8,in_stack_fffffffffffffb08,
             predicate_01);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_4c0 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_4c8 = 49.9181;
  local_4d8 = filter.grand.member.count;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","49.9181","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xcc,0x10639d,(char *)&local_4c0,&local_4c8,in_stack_fffffffffffffb08,
             predicate_00);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,2.0);
  local_4e0 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_4e8 = 47.2997;
  predicate.absolute = tolerance.relative;
  predicate.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","47.2997","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xce,0x10639d,(char *)&local_4e0,&local_4e8,
             (double *)filter.grand.member.count,predicate);
  return;
}

Assistant:

void test_alternating()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    cumulative::trend<double> filter;

    // Converge towards 1.5

    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.0, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 2.0, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.44444, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 1.83333, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.50667, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 1.75556, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.52517, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 1.70952, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.53192, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 1.67873, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.53438, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 1.65652, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.53501, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 1.63965, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.53479, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 1.62636, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.53415, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 1.61559, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.53333, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 1.60666, tolerance);

    // Outlier

    filter.push(1000.0);
    TRIAL_TEST_WITH(filter.value(), 139.716, tolerance);

    // Slow recovery

    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 129.374, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 119.974, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 111.631, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 103.971, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 97.1314, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 90.7946, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 85.1106, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 79.8012, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 75.0212, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 70.5231, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 66.4618, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 62.614, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 59.1323, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 55.8126, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 52.8039, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 49.9181, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 47.2997, tolerance);
}